

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O3

int CfdGetAddressInfo(void *handle,char *address,int *network_type,int *hash_type,
                     int *witness_version,char **locking_script,char **hash)

{
  pointer pcVar1;
  char **ppcVar2;
  bool bVar3;
  char *pcVar4;
  _func_int **__dest;
  char *pcVar5;
  CfdException *pCVar6;
  int iVar7;
  size_t __n;
  ulong uVar8;
  ElementsAddressFactory factory;
  char *work_locking_script;
  string err_msg;
  Address addr;
  allocator local_389;
  undefined1 local_388 [8];
  pointer puStack_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  void *local_360;
  char *local_358;
  char **local_350;
  string local_348;
  undefined8 local_328;
  undefined1 local_320 [32];
  char local_300 [16];
  pointer local_2f0;
  pointer local_2d8;
  pointer local_2c0;
  TapBranch local_2a8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_230;
  Script local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  undefined1 local_1a8 [32];
  char local_188 [16];
  pointer local_178;
  pointer local_170;
  pointer local_160;
  pointer local_148;
  TapBranch local_130;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_358 = (char *)0x0;
  local_328 = 0;
  local_360 = handle;
  cfd::Initialize();
  bVar3 = cfd::capi::IsEmptyString(address);
  if (bVar3) {
    local_1a8._0_8_ = "cfdcapi_address.cpp";
    local_1a8._8_4_ = 0x435;
    local_1a8._16_8_ = "CfdGetAddressInfo";
    cfd::core::logger::log<>((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,"address is null.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Failed to parameter. address is null.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::Address::Address((Address *)local_1a8);
  local_350 = locking_script;
  cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)local_388);
  std::__cxx11::string::string((string *)&local_348,address,&local_389);
  cfd::AddressFactory::GetAddress((Address *)local_320,(AddressFactory *)local_388,&local_348);
  cfd::core::Address::operator=((Address *)local_1a8,(Address *)local_320);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1d8);
  cfd::core::Script::~Script(&local_218);
  local_2a8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_230);
  cfd::core::TapBranch::~TapBranch(&local_2a8);
  if (local_2c0 != (pointer)0x0) {
    operator_delete(local_2c0);
  }
  if (local_2d8 != (pointer)0x0) {
    operator_delete(local_2d8);
  }
  if (local_2f0 != (pointer)0x0) {
    operator_delete(local_2f0);
  }
  if ((char *)local_320._16_8_ != local_300) {
    operator_delete((void *)local_320._16_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  local_388 = (undefined1  [8])&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &local_378);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_320,(Address *)local_1a8);
  pcVar1 = local_320 + 0x10;
  if ((pointer)local_320._0_8_ != pcVar1) {
    operator_delete((void *)local_320._0_8_);
  }
  if (CONCAT44(local_320._12_4_,local_320._8_4_) == 0) {
    cfd::AddressFactory::AddressFactory((AddressFactory *)local_388);
    std::__cxx11::string::string((string *)&local_348,address,&local_389);
    cfd::AddressFactory::GetAddress((Address *)local_320,(AddressFactory *)local_388,&local_348);
    cfd::core::Address::operator=((Address *)local_1a8,(Address *)local_320);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1d8);
    cfd::core::Script::~Script(&local_218);
    local_2a8._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_230);
    cfd::core::TapBranch::~TapBranch(&local_2a8);
    if (local_2c0 != (pointer)0x0) {
      operator_delete(local_2c0);
    }
    if (local_2d8 != (pointer)0x0) {
      operator_delete(local_2d8);
    }
    if (local_2f0 != (pointer)0x0) {
      operator_delete(local_2f0);
    }
    if ((char *)local_320._16_8_ != local_300) {
      operator_delete((void *)local_320._16_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p);
    }
    local_388 = (undefined1  [8])&PTR__AddressFactory_007215c8;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            &local_378);
  }
  if (network_type != (int *)0x0) {
    iVar7 = 0xc;
    if ((local_1a8._0_8_ & 0xffffffff) < 5) {
      iVar7 = *(int *)(&DAT_005e0e44 + (local_1a8._0_8_ & 0xffffffff) * 4);
    }
    *network_type = iVar7;
  }
  if (hash_type != (int *)0x0) {
    if (7 < local_1a8._4_4_ - kP2shAddress) {
      local_320._0_8_ = "cfdcapi_address.cpp";
      local_320._8_4_ = 0x481;
      local_320._16_8_ = "CfdGetAddressInfo";
      local_388._0_4_ = local_1a8._4_4_;
      cfd::core::logger::log<cfd::core::AddressType&>
                ((CfdSourceLocation *)local_320,kCfdLogLevelWarning,"Illegal hash type.({})",
                 (AddressType *)local_388);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_320._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Illegal hash type.","");
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_320);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    *hash_type = *(int *)(&DAT_005e0e58 + (ulong)(local_1a8._4_4_ - kP2shAddress) * 4);
  }
  if (witness_version != (int *)0x0) {
    *witness_version = local_1a8._8_4_;
  }
  cfd::core::Address::GetLockingScript((Script *)local_320,(Address *)local_1a8);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_388,(Script *)local_320);
  pcVar4 = cfd::capi::CreateString((string *)local_388);
  local_358 = pcVar4;
  if (local_388 != (undefined1  [8])&local_378) {
    operator_delete((void *)local_388);
  }
  cfd::core::Script::~Script((Script *)local_320);
  local_388 = (undefined1  [8])0x0;
  puStack_380 = (pointer)0x0;
  local_378._M_allocated_capacity = 0;
  uVar8 = (long)local_170 - (long)local_178;
  if (uVar8 == 0) {
    __dest = (_func_int **)0x0;
    __n = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (_func_int **)operator_new(uVar8);
    __n = (long)local_170 - (long)local_178;
  }
  local_378._M_allocated_capacity = uVar8 + (long)__dest;
  local_388 = (undefined1  [8])__dest;
  if (local_170 != local_178) {
    puStack_380 = (pointer)__dest;
    memmove(__dest,local_178,__n);
  }
  puStack_380 = (pointer)((long)__dest + __n);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_320,(ByteData *)local_388);
  pcVar5 = cfd::capi::CreateString((string *)local_320);
  if ((pointer)local_320._0_8_ != pcVar1) {
    operator_delete((void *)local_320._0_8_);
  }
  ppcVar2 = local_350;
  if (local_388 != (undefined1  [8])0x0) {
    operator_delete((void *)local_388);
  }
  if (ppcVar2 != (char **)0x0) {
    *ppcVar2 = pcVar4;
  }
  if (hash != (char **)0x0) {
    *hash = pcVar5;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  cfd::core::Script::~Script(&local_a0);
  local_130._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b8);
  cfd::core::TapBranch::~TapBranch(&local_130);
  if (local_148 != (pointer)0x0) {
    operator_delete(local_148);
  }
  if (local_160 != (pointer)0x0) {
    operator_delete(local_160);
  }
  if (local_178 != (pointer)0x0) {
    operator_delete(local_178);
  }
  if ((char *)local_1a8._16_8_ != local_188) {
    operator_delete((void *)local_1a8._16_8_);
  }
  return 0;
}

Assistant:

int CfdGetAddressInfo(
    void* handle, const char* address, int* network_type, int* hash_type,
    int* witness_version, char** locking_script, char** hash) {
  int error_code = CfdErrorCode::kCfdUnknownError;
  char* work_locking_script = nullptr;
  char* work_hash = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(address)) {
      warn(CFD_LOG_SOURCE, "address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null.");
    }

    Address addr;
#ifndef CFD_DISABLE_ELEMENTS
    try {
      ElementsAddressFactory factory;
      addr = factory.GetAddress(address);
    } catch (const CfdException& cfd_except) {
      std::string err_msg = cfd_except.what();
      if ((err_msg != "Base58 decode error.") &&
          (err_msg != "Unknown address prefix.")) {
        throw cfd_except;
      }
    }
#endif  // CFD_DISABLE_ELEMENTS

    if (addr.GetAddress().empty()) {
      AddressFactory factory;
      addr = factory.GetAddress(address);
    }

    if (network_type != nullptr) {
      switch (addr.GetNetType()) {
        case NetType::kMainnet:
          *network_type = kCfdNetworkMainnet;
          break;
        case NetType::kTestnet:
          *network_type = kCfdNetworkTestnet;
          break;
        case NetType::kRegtest:
          *network_type = kCfdNetworkRegtest;
          break;
        case NetType::kLiquidV1:
          *network_type = kCfdNetworkLiquidv1;
          break;
        case NetType::kElementsRegtest:
          *network_type = kCfdNetworkElementsRegtest;
          break;
        default:
          *network_type = kCfdNetworkCustomChain;
          break;
      }
    }

    if (hash_type != nullptr) {
      switch (addr.GetAddressType()) {
        case AddressType::kP2shAddress:
          *hash_type = kCfdP2sh;
          break;
        case AddressType::kP2pkhAddress:
          *hash_type = kCfdP2pkh;
          break;
        case AddressType::kP2wshAddress:
          *hash_type = kCfdP2wsh;
          break;
        case AddressType::kP2wpkhAddress:
          *hash_type = kCfdP2wpkh;
          break;
        case AddressType::kP2shP2wshAddress:
          *hash_type = kCfdP2shP2wsh;
          break;
        case AddressType::kP2shP2wpkhAddress:
          *hash_type = kCfdP2shP2wpkh;
          break;
        case AddressType::kTaprootAddress:
          *hash_type = kCfdTaproot;
          break;
        case AddressType::kWitnessUnknown:
          *hash_type = kCfdUnknown;
          break;
        default:
          warn(
              CFD_LOG_SOURCE, "Illegal hash type.({})", addr.GetAddressType());
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Illegal hash type.");
      }
    }

    if (witness_version != nullptr) {
      *witness_version = static_cast<int>(addr.GetWitnessVersion());
    }
    work_locking_script = CreateString(addr.GetLockingScript().GetHex());
    work_hash = CreateString(addr.GetHash().GetHex());

    if (locking_script != nullptr) {
      *locking_script = work_locking_script;
    }
    if (hash != nullptr) {
      *hash = work_hash;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    error_code = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_locking_script, &work_hash);
  return error_code;
}